

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::OurReader::readObject(OurReader *this,Token *token)

{
  TokenType TVar1;
  bool bVar2;
  _Elt_pointer ppVVar3;
  long *plVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  String name;
  Value numberName;
  Token colon;
  Token comma;
  Token tokenName;
  Value init;
  String local_f0;
  ValueHolder local_d0;
  long local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  String local_a8;
  Token local_88;
  Token local_70;
  Value local_58;
  
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  Value::Value(&local_58,objectValue);
  ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar3 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::swapPayload(ppVVar3[-1],&local_58);
  ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar3 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::setOffsetStart(ppVVar3[-1],(long)token->start_ - (long)this->begin_);
  do {
    bVar2 = readToken(this,&local_70);
    if (!bVar2) {
LAB_007b4565:
      local_d0.string_ = (char *)&local_c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"Missing \'}\' or object member name","");
      addError(this,(String *)&local_d0,&local_70,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
LAB_007b46e3:
      if (local_d0 != &local_c0) {
        operator_delete(local_d0.string_,local_c0._M_allocated_capacity + 1);
      }
LAB_007b46fa:
      bVar2 = false;
      goto LAB_007b46fc;
    }
    bVar2 = true;
    while( true ) {
      TVar1 = local_70.type_;
      if ((bVar2 == false) || (local_70.type_ != tokenComment)) break;
      bVar2 = readToken(this,&local_70);
    }
    if (bVar2 == false) goto LAB_007b4565;
    if (local_70.type_ == tokenObjectEnd) {
      bVar2 = true;
      if ((local_f0._M_string_length != 0) && ((this->features_).allowTrailingCommas_ == false)) {
        local_f0._M_string_length = 0;
        *local_f0._M_dataplus._M_p = '\0';
        goto LAB_007b4565;
      }
      goto LAB_007b46fc;
    }
    local_f0._M_string_length = 0;
    *local_f0._M_dataplus._M_p = '\0';
    if (TVar1 == tokenNumber) {
      if ((this->features_).allowNumericKeys_ != true) goto LAB_007b4565;
      Value::Value((Value *)&local_d0,nullValue);
      bVar2 = decodeNumber(this,&local_70,(Value *)&local_d0);
      if (bVar2) {
        Value::asString_abi_cxx11_(&local_a8,(Value *)&local_d0);
        std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p) !=
            &local_a8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p),
                          local_a8.field_2._M_allocated_capacity + 1);
        }
        Value::~Value((Value *)&local_d0);
        goto LAB_007b43ed;
      }
      recoverFromError(this,tokenObjectEnd);
      Value::~Value((Value *)&local_d0);
      goto LAB_007b46fa;
    }
    if (TVar1 != tokenString) goto LAB_007b4565;
    bVar2 = decodeString(this,&local_70,&local_f0);
    if (!bVar2) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_007b46fa;
    }
LAB_007b43ed:
    if (0x3fffffff < local_f0._M_string_length) {
      local_d0.string_ = (char *)&local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"keylength >= 2^30","");
      throwRuntimeError((String *)&local_d0);
    }
    if ((this->features_).rejectDupKeys_ == true) {
      ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVVar3 ==
          (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      bVar2 = Value::isMember(ppVVar3[-1],&local_f0);
      if (!bVar2) goto LAB_007b4433;
      std::operator+(&local_a8,"Duplicate key: \'",&local_f0);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_a8);
      local_d0.string_ = (char *)&local_c0;
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 == paVar5) {
        local_c0._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_c0._8_8_ = plVar4[3];
      }
      else {
        local_c0._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_d0.string_ = ((char *)*plVar4).string_;
      }
      local_c8 = plVar4[1];
      *plVar4 = (long)paVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p) !=
          &local_a8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p),
                        local_a8.field_2._M_allocated_capacity + 1);
      }
      addError(this,(String *)&local_d0,&local_70,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
      goto LAB_007b46e3;
    }
LAB_007b4433:
    bVar2 = readToken(this,(Token *)&local_a8);
    if (!bVar2 || (int)local_a8._M_dataplus._M_p != 0xe) {
      local_d0.string_ = (char *)&local_c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"Missing \':\' after object member name","");
      addError(this,(String *)&local_d0,(Token *)&local_a8,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
      goto LAB_007b46e3;
    }
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar3 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    local_d0.map_ = (ObjectValues *)Value::operator[](ppVVar3[-1],&local_f0);
    std::deque<Json::Value*,std::allocator<Json::Value*>>::emplace_back<Json::Value*>
              ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)&local_d0.map_);
    bVar2 = readValue(this);
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
    if (!bVar2) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_007b46fa;
    }
    bVar2 = readToken(this,&local_88);
    if (((!bVar2) || (tokenComment < local_88.type_)) ||
       ((0xa004U >> (local_88.type_ & (tokenError|tokenComment)) & 1) == 0)) {
      local_d0.string_ = (char *)&local_c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"Missing \',\' or \'}\' in object declaration","");
      addError(this,(String *)&local_d0,&local_88,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
      goto LAB_007b46e3;
    }
    bVar2 = true;
    while ((bVar2 != false && (local_88.type_ == tokenComment))) {
      bVar2 = readToken(this,&local_88);
    }
  } while (local_88.type_ != tokenObjectEnd);
  bVar2 = true;
LAB_007b46fc:
  Value::~Value(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool OurReader::readObject(Token& token) {
  Token tokenName;
  String name;
  Value init(objectValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(token.start_ - begin_);
  while (readToken(tokenName)) {
    bool initialTokenOk = true;
    while (tokenName.type_ == tokenComment && initialTokenOk)
      initialTokenOk = readToken(tokenName);
    if (!initialTokenOk)
      break;
    if (tokenName.type_ == tokenObjectEnd &&
        (name.empty() ||
         features_.allowTrailingCommas_)) // empty object or trailing comma
      return true;
    name.clear();
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = numberName.asString();
    } else {
      break;
    }
    if (name.length() >= (1U << 30))
      throwRuntimeError("keylength >= 2^30");
    if (features_.rejectDupKeys_ && currentValue().isMember(name)) {
      String msg = "Duplicate key: '" + name + "'";
      return addErrorAndRecover(msg, tokenName, tokenObjectEnd);
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover("Missing ':' after object member name", colon,
                                tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readToken(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator &&
         comma.type_ != tokenComment)) {
      return addErrorAndRecover("Missing ',' or '}' in object declaration",
                                comma, tokenObjectEnd);
    }
    bool finalizeTokenOk = true;
    while (comma.type_ == tokenComment && finalizeTokenOk)
      finalizeTokenOk = readToken(comma);
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover("Missing '}' or object member name", tokenName,
                            tokenObjectEnd);
}